

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O0

void __thiscall HighsCliqueTable::runCliqueMerging(HighsCliqueTable *this,HighsDomain *globaldomain)

{
  int iVar1;
  int iVar2;
  value_type vVar3;
  bool bVar4;
  HighsInt HVar5;
  size_type sVar6;
  size_type sVar7;
  reference pvVar8;
  char *pcVar9;
  reference pvVar10;
  HighsCliqueTable *pHVar11;
  reference pvVar12;
  reference pCVar13;
  reference piVar14;
  reference pvVar15;
  int __c;
  int __c_00;
  int __c_01;
  int __c_02;
  int __c_03;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar16;
  undefined8 extraout_RDX_03;
  HighsCliqueTable *in_RSI;
  undefined1 **ppuVar17;
  CliqueVar **ppCVar18;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *in_RDI;
  pointer *this_00;
  HighsInt k_1;
  HighsInt i_6;
  HighsInt i_5;
  bool vHasClq;
  bool sizeTwo;
  CliqueVar v_3;
  iterator __end7;
  iterator __begin7;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *__range7;
  HighsInt hits;
  HighsInt cliqueid;
  iterator __end3_2;
  iterator __begin3_2;
  vector<int,_std::allocator<int>_> *__range3_2;
  HighsInt dominatingOrigin;
  bool redundant;
  CliqueVar v_2;
  iterator __end3_1;
  iterator __begin3_1;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *__range3_1;
  HighsInt numExtensions;
  HighsInt originrow;
  CliqueVar v_1;
  iterator __end3;
  iterator __begin3;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *__range3;
  HighsInt newSize_1;
  CliqueVar extvar;
  size_t i_4;
  HighsInt newSize;
  HighsInt i_3;
  CliqueVar v;
  iterator __end2;
  iterator __begin2;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *__range2;
  HighsInt i_2;
  anon_class_24_3_1a0f6629 addCands;
  HighsInt i_1;
  HighsInt thisNumClqs;
  HighsInt i;
  HighsInt numcliques;
  CliqueVar extensionstart;
  CliqueVar *clqvars;
  HighsInt numclqvars;
  HighsInt k;
  bool haveNonModelCliquesToMerge;
  HighsInt maxNewEntries;
  HighsInt numcliqueslots;
  vector<int,_std::allocator<int>_> neighbourhoodInds;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> extensionvars;
  HighsCliqueTable *in_stack_fffffffffffffae8;
  CliqueVar *in_stack_fffffffffffffaf0;
  CliqueVar *in_stack_fffffffffffffaf8;
  CliqueVar *in_stack_fffffffffffffb00;
  anon_class_8_1_15f2b025_for__M_pred in_stack_fffffffffffffb08;
  const_iterator in_stack_fffffffffffffb10;
  const_iterator in_stack_fffffffffffffb18;
  HighsCliqueTable *in_stack_fffffffffffffb20;
  CliqueVar *in_stack_fffffffffffffb28;
  HighsCliqueTable *in_stack_fffffffffffffb30;
  iterator in_stack_fffffffffffffb38;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  in_stack_fffffffffffffb40;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  in_stack_fffffffffffffb48;
  bool local_492;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
  *in_stack_fffffffffffffc08;
  CliqueVar *in_stack_fffffffffffffc10;
  undefined4 in_stack_fffffffffffffc18;
  HighsInt in_stack_fffffffffffffc1c;
  HighsCliqueTable *in_stack_fffffffffffffc20;
  byte local_391;
  int local_2d0;
  int local_2cc;
  iterator in_stack_fffffffffffffd38;
  iterator in_stack_fffffffffffffd40;
  HighsDomain *in_stack_fffffffffffffd48;
  HighsCliqueTable *in_stack_fffffffffffffd50;
  int local_284;
  CliqueVar local_27c;
  CliqueVar *local_278;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  local_270;
  undefined1 *local_268;
  value_type local_260;
  int local_25c;
  int *local_258;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_250;
  pointer *local_248;
  HighsInt local_240;
  byte local_239;
  char local_230 [12];
  CliqueVar local_224;
  CliqueVar *local_220;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  local_218;
  undefined1 *local_210;
  CliqueVar *local_208;
  CliqueVar *local_200;
  CliqueVar *local_1e8;
  CliqueVar *local_1e0;
  CliqueVar *local_1d8;
  CliqueVar *local_1d0;
  CliqueVar *local_1c0;
  CliqueVar *local_1b8;
  CliqueVar *local_1b0;
  CliqueVar *local_1a8;
  CliqueVar *local_1a0;
  CliqueVar *local_198;
  int local_184;
  HighsInt local_180;
  CliqueVar local_17c;
  CliqueVar *local_178;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  local_170;
  undefined1 *local_168;
  CliqueVar *local_160;
  CliqueVar *local_158;
  CliqueVar *local_148;
  CliqueVar *local_140;
  value_type local_12c;
  int local_128;
  value_type local_124;
  HighsCliqueTable *local_120;
  CliqueVar *local_118;
  CliqueVar *local_110;
  CliqueVar *local_100;
  CliqueVar *local_f8;
  value_type local_e8;
  HighsInt local_e4;
  int local_e0;
  CliqueVar local_dc;
  CliqueVar *local_d8;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  local_d0;
  undefined1 *local_c8;
  int local_bc;
  undefined1 *local_b8;
  undefined1 *local_b0;
  undefined1 local_a8 [8];
  HighsCliqueTable *local_a0;
  undefined1 *local_98;
  int local_8c;
  value_type local_88;
  HighsInt local_84;
  int local_80;
  value_type local_7c;
  HighsInt local_78;
  value_type local_74;
  reference local_70;
  int local_64;
  int local_60;
  byte local_59;
  int local_58;
  int local_54;
  HighsCliqueTable *local_10;
  
  local_10 = in_RSI;
  std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::vector
            ((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *)
             0x53c9f4);
  std::vector<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>::size
            ((vector<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_> *)
             (in_RDI + 1));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             in_stack_fffffffffffffb10._M_current,(size_type)in_stack_fffffffffffffb08.globaldomain)
  ;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x53ca3d);
  std::vector<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>::size
            ((vector<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_> *)
             (in_RDI + 1));
  std::vector<int,_std::allocator<int>_>::reserve
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb20,
             (size_type)in_stack_fffffffffffffb18._M_current);
  sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     &in_RDI[0x10].
                      super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  sVar7 = std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::size
                    ((vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_> *)
                     &in_RDI[7].
                      super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (sVar6 < sVar7) {
    std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::size
              ((vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_> *)
               &in_RDI[7].
                super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               in_stack_fffffffffffffb10._M_current,
               (size_type)in_stack_fffffffffffffb08.globaldomain);
  }
  sVar6 = std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::size
                    ((vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_> *)
                     &in_RDI[7].
                      super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_54 = (int)sVar6;
  iVar1 = *(int *)((long)&in_RDI[0x13].
                          super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                          ._M_impl.super__Vector_impl_data._M_start + 4);
  HVar5 = HighsDomain::numModelNonzeros((HighsDomain *)0x53cb58);
  local_58 = iVar1 + HVar5;
  local_59 = 0;
  for (local_60 = 0; local_60 != local_54; local_60 = local_60 + 1) {
    pvVar8 = std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::
             operator[]((vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                         *)&in_RDI[7].
                            super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_60);
    if ((pvVar8->start != -1) &&
       ((pvVar8 = std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::
                  operator[]((vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                              *)&in_RDI[7].
                                 super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_60),
        (pvVar8->equality & 1U) != 0 ||
        (pvVar8 = std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::
                  operator[]((vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                              *)&in_RDI[7].
                                 super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_60),
        pvVar8->origin != 0x7fffffff)))) {
      pvVar8 = std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::
               operator[]((vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                           *)&in_RDI[7].
                              super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_60);
      if (pvVar8->origin == -1) {
        local_59 = 1;
      }
      else {
        pvVar8 = std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::
                 operator[]((vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                             *)&in_RDI[7].
                                super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_60);
        iVar1 = pvVar8->end;
        pvVar8 = std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::
                 operator[]((vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                             *)&in_RDI[7].
                                super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_60);
        local_64 = iVar1 - pvVar8->start;
        if (local_64 != 0) {
          pvVar8 = std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                   ::operator[]((vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                                 *)&in_RDI[7].
                                    super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                (long)local_60);
          local_70 = std::
                     vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                     ::operator[](in_RDI,(long)pvVar8->start);
          local_74 = *local_70;
          local_7c = *local_70;
          pcVar9 = (char *)(ulong)(uint)local_7c;
          local_78 = numCliques(in_stack_fffffffffffffae8,
                                SUB84((ulong)in_stack_fffffffffffffaf0 >> 0x20,0));
          uVar16 = extraout_RDX;
          for (local_80 = 1; local_80 != local_64; local_80 = local_80 + 1) {
            local_88 = local_70[local_80];
            pcVar9 = (char *)(ulong)(uint)local_88;
            local_84 = numCliques(in_stack_fffffffffffffae8,
                                  SUB84((ulong)in_stack_fffffffffffffaf0 >> 0x20,0));
            if (local_84 < local_78) {
              local_74 = local_70[local_80];
              local_78 = local_84;
            }
            uVar16 = extraout_RDX_00;
          }
          for (local_8c = 0; local_8c != local_64; local_8c = local_8c + 1) {
            pcVar9 = CliqueVar::index(local_70 + local_8c,pcVar9,(int)uVar16);
            pcVar9 = (char *)(long)(int)pcVar9;
            pvVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 &in_RDI[0xe].
                                  super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (size_type)pcVar9);
            *pvVar10 = '\x01';
            uVar16 = extraout_RDX_01;
          }
          local_a0 = local_10;
          local_98 = &stack0xffffffffffffffd8;
          pcVar9 = CliqueVar::index(&local_74,pcVar9,(int)uVar16);
          std::vector<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>::
          operator[]((vector<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_> *)
                     (in_RDI + 1),(long)(int)pcVar9);
          local_b0 = local_a8;
          ppuVar17 = &local_b0;
          HighsHashTree<int,int>::for_each<HighsCliqueTable::runCliqueMerging(HighsDomain&)::__0>
                    ((HighsHashTree<int,_int> *)in_stack_fffffffffffffaf0,
                     (anon_class_8_1_9cafd1bc_conflict *)in_stack_fffffffffffffae8);
          pcVar9 = CliqueVar::index(&local_74,(char *)ppuVar17,__c);
          std::vector<HighsHashTree<int,_void>,_std::allocator<HighsHashTree<int,_void>_>_>::
          operator[]((vector<HighsHashTree<int,_void>,_std::allocator<HighsHashTree<int,_void>_>_> *
                     )(in_RDI + 2),(long)(int)pcVar9);
          local_b8 = local_a8;
          ppuVar17 = &local_b8;
          HighsHashTree<int,void>::for_each<HighsCliqueTable::runCliqueMerging(HighsDomain&)::__1>
                    ((HighsHashTree<int,_void> *)in_stack_fffffffffffffaf0,
                     (anon_class_8_1_9cafd1bc_conflict *)in_stack_fffffffffffffae8);
          uVar16 = extraout_RDX_02;
          for (local_bc = 0; local_bc != local_64; local_bc = local_bc + 1) {
            pcVar9 = CliqueVar::index(local_70 + local_bc,(char *)ppuVar17,(int)uVar16);
            ppuVar17 = (undefined1 **)(long)(int)pcVar9;
            pvVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 &in_RDI[0xe].
                                  super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (size_type)ppuVar17);
            *pvVar10 = '\0';
            uVar16 = extraout_RDX_03;
          }
          local_c8 = &stack0xffffffffffffffd8;
          local_d0._M_current =
               (CliqueVar *)
               std::
               vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
               begin(&in_stack_fffffffffffffae8->cliqueentries);
          local_d8 = (CliqueVar *)
                     std::
                     vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                     ::end(&in_stack_fffffffffffffae8->cliqueentries);
          while( true ) {
            ppCVar18 = &local_d8;
            bVar4 = __gnu_cxx::operator!=
                              ((__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                                *)in_stack_fffffffffffffaf0,
                               (__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                                *)in_stack_fffffffffffffae8);
            if (!bVar4) break;
            pCVar13 = __gnu_cxx::
                      __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                      ::operator*(&local_d0);
            local_dc = *pCVar13;
            pcVar9 = CliqueVar::index(&local_dc,(char *)ppCVar18,__c_00);
            pvVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 &in_RDI[0xe].
                                  super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (long)(int)pcVar9);
            *pvVar10 = '\0';
            __gnu_cxx::
            __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
            ::operator++(&local_d0);
          }
          local_e0 = 0;
          while( true ) {
            local_391 = 0;
            if (local_e0 != local_64) {
              bVar4 = std::
                      vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                      ::empty((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                               *)in_stack_fffffffffffffb00);
              local_391 = bVar4 ^ 0xff;
            }
            if ((local_391 & 1) == 0) break;
            bVar4 = CliqueVar::operator==
                              (in_stack_fffffffffffffaf0,(CliqueVar *)in_stack_fffffffffffffae8);
            if (!bVar4) {
              local_e8 = local_70[local_e0];
              std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
              ::data((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                      *)0x53d158);
              std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
              ::size((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                      *)&stack0xffffffffffffffd8);
              local_e4 = shrinkToNeighbourhood
                                   ((HighsCliqueTable *)in_stack_fffffffffffffb18._M_current,
                                    (vector<int,_std::allocator<int>_> *)
                                    in_stack_fffffffffffffb10._M_current,
                                    (int64_t *)in_stack_fffffffffffffb08.globaldomain,
                                    SUB84((ulong)in_stack_fffffffffffffb20 >> 0x20,0),
                                    in_stack_fffffffffffffb00,
                                    (HighsInt)((ulong)in_stack_fffffffffffffaf8 >> 0x20));
              local_100 = (CliqueVar *)
                          std::
                          vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                          ::begin(&in_stack_fffffffffffffae8->cliqueentries);
              local_f8 = (CliqueVar *)
                         __gnu_cxx::
                         __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                         ::operator+((__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                                      *)in_stack_fffffffffffffaf8,
                                     (difference_type)in_stack_fffffffffffffaf0);
              __gnu_cxx::
              __normal_iterator<HighsCliqueTable::CliqueVar_const*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>
              ::__normal_iterator<HighsCliqueTable::CliqueVar*>
                        ((__normal_iterator<const_HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                          *)in_stack_fffffffffffffaf0,
                         (__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                          *)in_stack_fffffffffffffae8);
              local_110 = (CliqueVar *)
                          std::
                          vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                          ::end(&in_stack_fffffffffffffae8->cliqueentries);
              __gnu_cxx::
              __normal_iterator<HighsCliqueTable::CliqueVar_const*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>
              ::__normal_iterator<HighsCliqueTable::CliqueVar*>
                        ((__normal_iterator<const_HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                          *)in_stack_fffffffffffffaf0,
                         (__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                          *)in_stack_fffffffffffffae8);
              local_118 = (CliqueVar *)
                          std::
                          vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                          ::erase((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                   *)in_stack_fffffffffffffb08.globaldomain,
                                  in_stack_fffffffffffffb18,in_stack_fffffffffffffb10);
            }
            local_e0 = local_e0 + 1;
          }
          bVar4 = std::
                  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                  ::empty((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                           *)in_stack_fffffffffffffb00);
          if (!bVar4) {
            std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
            data((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                  *)0x53d2b9);
            std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
            size((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                  *)&stack0xffffffffffffffd8);
            HighsRandom::shuffle<HighsCliqueTable::CliqueVar>
                      ((HighsRandom *)in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,
                       (HighsInt)((ulong)in_stack_fffffffffffffaf0 >> 0x20));
            local_120 = (HighsCliqueTable *)0x0;
            while (in_stack_fffffffffffffc20 = local_120,
                  pHVar11 = (HighsCliqueTable *)
                            std::
                            vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                            ::size((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                    *)&stack0xffffffffffffffd8), in_stack_fffffffffffffc20 < pHVar11
                  ) {
              pvVar12 = std::
                        vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                        ::operator[]((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                      *)&stack0xffffffffffffffd8,(size_type)local_120);
              local_12c = *pvVar12;
              pHVar11 = (HighsCliqueTable *)
                        ((long)&(local_120->cliqueentries).
                                super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                ._M_impl.super__Vector_impl_data._M_start + 1);
              in_stack_fffffffffffffc08 = in_RDI + 0x14;
              local_124 = local_12c;
              local_120 = pHVar11;
              in_stack_fffffffffffffc10 =
                   std::
                   vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                   ::data((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                           *)0x53d3a1);
              in_stack_fffffffffffffc10 = in_stack_fffffffffffffc10 + (long)local_120;
              std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
              ::size((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                      *)&stack0xffffffffffffffd8);
              in_stack_fffffffffffffc1c =
                   shrinkToNeighbourhood
                             ((HighsCliqueTable *)in_stack_fffffffffffffb18._M_current,
                              (vector<int,_std::allocator<int>_> *)
                              in_stack_fffffffffffffb10._M_current,
                              (int64_t *)in_stack_fffffffffffffb08.globaldomain,
                              SUB84((ulong)in_stack_fffffffffffffb20 >> 0x20,0),
                              in_stack_fffffffffffffb00,
                              (HighsInt)((ulong)in_stack_fffffffffffffaf8 >> 0x20));
              local_128 = (int)pHVar11 + in_stack_fffffffffffffc1c;
              local_148 = (CliqueVar *)
                          std::
                          vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                          ::begin(&in_stack_fffffffffffffae8->cliqueentries);
              local_140 = (CliqueVar *)
                          __gnu_cxx::
                          __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                          ::operator+((__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                                       *)in_stack_fffffffffffffaf8,
                                      (difference_type)in_stack_fffffffffffffaf0);
              __gnu_cxx::
              __normal_iterator<HighsCliqueTable::CliqueVar_const*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>
              ::__normal_iterator<HighsCliqueTable::CliqueVar*>
                        ((__normal_iterator<const_HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                          *)in_stack_fffffffffffffaf0,
                         (__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                          *)in_stack_fffffffffffffae8);
              local_158 = (CliqueVar *)
                          std::
                          vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                          ::end(&in_stack_fffffffffffffae8->cliqueentries);
              __gnu_cxx::
              __normal_iterator<HighsCliqueTable::CliqueVar_const*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>
              ::__normal_iterator<HighsCliqueTable::CliqueVar*>
                        ((__normal_iterator<const_HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                          *)in_stack_fffffffffffffaf0,
                         (__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                          *)in_stack_fffffffffffffae8);
              local_160 = (CliqueVar *)
                          std::
                          vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                          ::erase((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                   *)in_stack_fffffffffffffb08.globaldomain,
                                  in_stack_fffffffffffffb18,in_stack_fffffffffffffb10);
            }
          }
          pvVar8 = std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                   ::operator[]((vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                                 *)&in_RDI[7].
                                    super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                (long)local_60);
          if ((pvVar8->equality & 1U) == 0) {
            this_00 = &in_RDI[7].
                       super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
            pvVar8 = std::
                     vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::
                     operator[]((vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                                 *)this_00,(long)local_60);
            local_180 = pvVar8->origin;
            pvVar8 = std::
                     vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::
                     operator[]((vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                                 *)this_00,(long)local_60);
            pvVar8->origin = 0x7fffffff;
            sVar6 = std::
                    vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                    ::size((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                            *)&stack0xffffffffffffffd8);
            local_184 = (int)sVar6;
            local_198 = (CliqueVar *)
                        std::
                        vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                        ::end(&in_stack_fffffffffffffae8->cliqueentries);
            __gnu_cxx::
            __normal_iterator<HighsCliqueTable::CliqueVar_const*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>
            ::__normal_iterator<HighsCliqueTable::CliqueVar*>
                      ((__normal_iterator<const_HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                        *)in_stack_fffffffffffffaf0,
                       (__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                        *)in_stack_fffffffffffffae8);
            local_1a8 = (CliqueVar *)
                        std::
                        vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                        ::begin(&in_stack_fffffffffffffae8->cliqueentries);
            std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::
            operator[]((vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                        *)this_00,(long)local_60);
            local_1a0 = (CliqueVar *)
                        __gnu_cxx::
                        __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                        ::operator+((__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                                     *)in_stack_fffffffffffffaf8,
                                    (difference_type)in_stack_fffffffffffffaf0);
            local_1b8 = (CliqueVar *)
                        std::
                        vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                        ::begin(&in_stack_fffffffffffffae8->cliqueentries);
            std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::
            operator[]((vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                        *)this_00,(long)local_60);
            local_1b0 = (CliqueVar *)
                        __gnu_cxx::
                        __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                        ::operator+((__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                                     *)in_stack_fffffffffffffaf8,
                                    (difference_type)in_stack_fffffffffffffaf0);
            local_1c0 = (CliqueVar *)
                        std::
                        vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>
                        ::
                        insert<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>,void>
                                  (&in_stack_fffffffffffffb30->cliqueentries,
                                   in_stack_fffffffffffffb48._M_current,in_stack_fffffffffffffb40,
                                   in_stack_fffffffffffffb38._M_current);
            local_1e0 = (CliqueVar *)
                        std::
                        vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                        ::begin(&in_stack_fffffffffffffae8->cliqueentries);
            local_1d8 = (CliqueVar *)
                        __gnu_cxx::
                        __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                        ::operator+((__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                                     *)in_stack_fffffffffffffaf8,
                                    (difference_type)in_stack_fffffffffffffaf0);
            local_1e8 = (CliqueVar *)
                        std::
                        vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                        ::end(&in_stack_fffffffffffffae8->cliqueentries);
            local_1d0 = (CliqueVar *)
                        std::
                        remove_if<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>,HighsCliqueTable::runCliqueMerging(HighsDomain&)::__2>
                                  (in_stack_fffffffffffffb18._M_current,
                                   in_stack_fffffffffffffb10._M_current,
                                   (anon_class_8_1_8991fb9c_for__M_pred)
                                   in_stack_fffffffffffffb08.globaldomain);
            __gnu_cxx::
            __normal_iterator<HighsCliqueTable::CliqueVar_const*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>
            ::__normal_iterator<HighsCliqueTable::CliqueVar*>
                      ((__normal_iterator<const_HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                        *)in_stack_fffffffffffffaf0,
                       (__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                        *)in_stack_fffffffffffffae8);
            local_200 = (CliqueVar *)
                        std::
                        vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                        ::end(&in_stack_fffffffffffffae8->cliqueentries);
            __gnu_cxx::
            __normal_iterator<HighsCliqueTable::CliqueVar_const*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>
            ::__normal_iterator<HighsCliqueTable::CliqueVar*>
                      ((__normal_iterator<const_HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                        *)in_stack_fffffffffffffaf0,
                       (__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                        *)in_stack_fffffffffffffae8);
            local_208 = (CliqueVar *)
                        std::
                        vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                        ::erase((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                 *)in_stack_fffffffffffffb08.globaldomain,in_stack_fffffffffffffb18,
                                in_stack_fffffffffffffb10);
            removeClique(in_stack_fffffffffffffb30,
                         (HighsInt)((ulong)in_stack_fffffffffffffb28 >> 0x20));
            local_210 = &stack0xffffffffffffffd8;
            local_218._M_current =
                 (CliqueVar *)
                 std::
                 vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
                 begin(&in_stack_fffffffffffffae8->cliqueentries);
            local_220 = (CliqueVar *)
                        std::
                        vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                        ::end(&in_stack_fffffffffffffae8->cliqueentries);
            while( true ) {
              ppCVar18 = &local_220;
              bVar4 = __gnu_cxx::operator!=
                                ((__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                                  *)in_stack_fffffffffffffaf0,
                                 (__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                                  *)in_stack_fffffffffffffae8);
              if (!bVar4) break;
              pCVar13 = __gnu_cxx::
                        __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                        ::operator*(&local_218);
              local_224 = *pCVar13;
              pcVar9 = CliqueVar::index(&local_224,(char *)ppCVar18,__c_01);
              std::vector<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>::
              operator[]((vector<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>
                          *)(in_RDI + 1),(long)(int)pcVar9);
              pcVar9 = local_230;
              HighsHashTree<int,int>::
              for_each<HighsCliqueTable::runCliqueMerging(HighsDomain&)::__3>
                        ((HighsHashTree<int,_int> *)in_stack_fffffffffffffaf0,
                         (anon_class_8_1_8991fb9c *)in_stack_fffffffffffffae8);
              pcVar9 = CliqueVar::index(&local_224,pcVar9,__c_02);
              std::vector<HighsHashTree<int,_void>,_std::allocator<HighsHashTree<int,_void>_>_>::
              operator[]((vector<HighsHashTree<int,_void>,_std::allocator<HighsHashTree<int,_void>_>_>
                          *)(in_RDI + 2),(long)(int)pcVar9);
              HighsHashTree<int,void>::
              for_each<HighsCliqueTable::runCliqueMerging(HighsDomain&)::__4>
                        ((HighsHashTree<int,_void> *)in_stack_fffffffffffffaf0,
                         (anon_class_8_1_8991fb9c *)in_stack_fffffffffffffae8);
              __gnu_cxx::
              __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
              ::operator++(&local_218);
            }
            local_239 = 0;
            local_240 = 0x7fffffff;
            local_248 = &in_RDI[0x11].
                         super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_250._M_current =
                 (int *)std::vector<int,_std::allocator<int>_>::begin
                                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffae8);
            local_258 = (int *)std::vector<int,_std::allocator<int>_>::end
                                         ((vector<int,_std::allocator<int>_> *)
                                          in_stack_fffffffffffffae8);
            while (bVar4 = __gnu_cxx::operator!=
                                     ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                       *)in_stack_fffffffffffffaf0,
                                      (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                       *)in_stack_fffffffffffffae8), bVar4) {
              piVar14 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                        ::operator*(&local_250);
              local_25c = *piVar14;
              pvVar15 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                   &in_RDI[0x10].
                                    super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                   (long)local_25c);
              local_260 = *pvVar15;
              pvVar15 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                   &in_RDI[0x10].
                                    super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                   (long)local_25c);
              vVar3 = local_260;
              *pvVar15 = 0;
              sVar6 = std::
                      vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                      ::size((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                              *)&stack0xffffffffffffffd8);
              if (vVar3 == (value_type)sVar6) {
                local_239 = 1;
                pvVar8 = std::
                         vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                         ::operator[]((vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                                       *)&in_RDI[7].
                                          super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                      (long)local_25c);
                if ((pvVar8->origin != 0x7fffffff) &&
                   (pvVar8 = std::
                             vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                             ::operator[]((vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                                           *)&in_RDI[7].
                                              super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                          (long)local_25c), pvVar8->origin != -1)) {
                  pvVar8 = std::
                           vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                           ::operator[]((vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                                         *)&in_RDI[7].
                                            super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                        (long)local_25c);
                  local_240 = pvVar8->origin;
                }
              }
              else {
                pvVar8 = std::
                         vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                         ::operator[]((vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                                       *)&in_RDI[7].
                                          super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                      (long)local_25c);
                iVar1 = pvVar8->end;
                pvVar8 = std::
                         vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                         ::operator[]((vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                                       *)&in_RDI[7].
                                          super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                      (long)local_25c);
                iVar2 = pvVar8->start;
                pvVar8 = std::
                         vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                         ::operator[]((vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                                       *)&in_RDI[7].
                                          super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                      (long)local_25c);
                if ((iVar1 - iVar2) - pvVar8->numZeroFixed == local_260) {
                  pvVar8 = std::
                           vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                           ::operator[]((vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                                         *)&in_RDI[7].
                                            super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                        (long)local_25c);
                  if ((pvVar8->equality & 1U) == 0) {
                    removeClique(in_stack_fffffffffffffb30,
                                 (HighsInt)((ulong)in_stack_fffffffffffffb28 >> 0x20));
                  }
                  else {
                    local_268 = &stack0xffffffffffffffd8;
                    local_270._M_current =
                         (CliqueVar *)
                         std::
                         vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                         ::begin(&in_stack_fffffffffffffae8->cliqueentries);
                    local_278 = (CliqueVar *)
                                std::
                                vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                ::end(&in_stack_fffffffffffffae8->cliqueentries);
                    while (bVar4 = __gnu_cxx::operator!=
                                             ((__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                                               *)in_stack_fffffffffffffaf0,
                                              (__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                                               *)in_stack_fffffffffffffae8), bVar4) {
                      pCVar13 = __gnu_cxx::
                                __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                                ::operator*(&local_270);
                      local_27c = *pCVar13;
                      pvVar8 = std::
                               vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                               ::operator[]((vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                                             *)&in_RDI[7].
                                                super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                            (long)local_25c);
                      iVar1 = pvVar8->end;
                      pcVar9 = (char *)(long)local_25c;
                      pvVar8 = std::
                               vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                               ::operator[]((vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                                             *)&in_RDI[7].
                                                super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                            (size_type)pcVar9);
                      if (iVar1 - pvVar8->start == 2) {
                        pcVar9 = CliqueVar::index(&local_27c,pcVar9,__c_03);
                        std::
                        vector<HighsHashTree<int,_void>,_std::allocator<HighsHashTree<int,_void>_>_>
                        ::operator[]((vector<HighsHashTree<int,_void>,_std::allocator<HighsHashTree<int,_void>_>_>
                                      *)(in_RDI + 2),(long)(int)pcVar9);
                        local_492 = HighsHashTree<int,_void>::contains
                                              ((HighsHashTree<int,_void> *)in_stack_fffffffffffffb00
                                               ,(int *)in_stack_fffffffffffffaf8);
                      }
                      else {
                        pcVar9 = CliqueVar::index(&local_27c,pcVar9,__c_03);
                        std::
                        vector<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>::
                        operator[]((vector<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>
                                    *)(in_RDI + 1),(long)(int)pcVar9);
                        local_492 = HighsHashTree<int,_int>::contains
                                              ((HighsHashTree<int,_int> *)in_stack_fffffffffffffb00,
                                               (int *)in_stack_fffffffffffffaf8);
                      }
                      if (local_492 == false) {
                        std::
                        vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                        ::push_back((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                     *)in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
                      }
                      __gnu_cxx::
                      __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                      ::operator++(&local_270);
                    }
                  }
                }
              }
              __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
              operator++(&local_250);
            }
            std::vector<int,_std::allocator<int>_>::clear
                      ((vector<int,_std::allocator<int>_> *)0x53ddc5);
            if ((local_239 & 1) == 0) {
              for (local_284 = 0; local_284 < local_184; local_284 = local_284 + 1) {
                std::
                vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
                operator[]((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                            *)&stack0xffffffffffffffd8,(long)local_284);
                std::
                vector<std::pair<int,HighsCliqueTable::CliqueVar>,std::allocator<std::pair<int,HighsCliqueTable::CliqueVar>>>
                ::emplace_back<int&,HighsCliqueTable::CliqueVar&>
                          ((vector<std::pair<int,_HighsCliqueTable::CliqueVar>,_std::allocator<std::pair<int,_HighsCliqueTable::CliqueVar>_>_>
                            *)in_stack_fffffffffffffb00,(int *)in_stack_fffffffffffffaf8,
                           in_stack_fffffffffffffaf0);
              }
              in_stack_fffffffffffffb40._M_current = (CliqueVar *)&stack0xffffffffffffffd8;
              std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
              ::begin(&in_stack_fffffffffffffae8->cliqueentries);
              std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
              ::end(&in_stack_fffffffffffffae8->cliqueentries);
              in_stack_fffffffffffffd50 = local_10;
              in_stack_fffffffffffffb48 =
                   std::
                   remove_if<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>,HighsCliqueTable::runCliqueMerging(HighsDomain&)::__5>
                             (in_stack_fffffffffffffb18._M_current,
                              in_stack_fffffffffffffb10._M_current,in_stack_fffffffffffffb08);
              __gnu_cxx::
              __normal_iterator<HighsCliqueTable::CliqueVar_const*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>
              ::__normal_iterator<HighsCliqueTable::CliqueVar*>
                        ((__normal_iterator<const_HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                          *)in_stack_fffffffffffffaf0,
                         (__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                          *)in_stack_fffffffffffffae8);
              in_stack_fffffffffffffb30 = (HighsCliqueTable *)&stack0xffffffffffffffd8;
              in_stack_fffffffffffffd40 =
                   std::
                   vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                   ::end(&in_stack_fffffffffffffae8->cliqueentries);
              __gnu_cxx::
              __normal_iterator<HighsCliqueTable::CliqueVar_const*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>
              ::__normal_iterator<HighsCliqueTable::CliqueVar*>
                        ((__normal_iterator<const_HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                          *)in_stack_fffffffffffffaf0,
                         (__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                          *)in_stack_fffffffffffffae8);
              in_stack_fffffffffffffb38 =
                   std::
                   vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                   ::erase((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                            *)in_stack_fffffffffffffb08.globaldomain,in_stack_fffffffffffffb18,
                           in_stack_fffffffffffffb10);
              in_stack_fffffffffffffd38 = in_stack_fffffffffffffb38;
              sVar6 = std::
                      vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                      ::size((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                              *)&stack0xffffffffffffffd8);
              if (1 < sVar6) {
                in_stack_fffffffffffffb20 = (HighsCliqueTable *)&stack0xffffffffffffffd8;
                in_stack_fffffffffffffb28 =
                     std::
                     vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                     ::data((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                             *)0x53df46);
                std::
                vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
                size(&in_stack_fffffffffffffb20->cliqueentries);
                doAddClique(in_stack_fffffffffffffc20,
                            (CliqueVar *)
                            CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18),
                            (HighsInt)((ulong)in_stack_fffffffffffffc10 >> 0x20),
                            SUB81((ulong)in_stack_fffffffffffffc10 >> 0x18,0),
                            (HighsInt)((ulong)in_stack_fffffffffffffc08 >> 0x20));
              }
            }
            else if (local_240 == 0x7fffffff) {
              for (local_2cc = 0; local_2cc < local_184; local_2cc = local_2cc + 1) {
                in_stack_fffffffffffffb18._M_current =
                     (CliqueVar *)
                     &in_RDI[0xd].
                      super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
                std::
                vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
                operator[]((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                            *)&stack0xffffffffffffffd8,(long)local_2cc);
                std::
                vector<std::pair<int,HighsCliqueTable::CliqueVar>,std::allocator<std::pair<int,HighsCliqueTable::CliqueVar>>>
                ::emplace_back<int&,HighsCliqueTable::CliqueVar&>
                          ((vector<std::pair<int,_HighsCliqueTable::CliqueVar>,_std::allocator<std::pair<int,_HighsCliqueTable::CliqueVar>_>_>
                            *)in_stack_fffffffffffffb00,(int *)in_stack_fffffffffffffaf8,
                           in_stack_fffffffffffffaf0);
              }
            }
            else {
              std::vector<int,_std::allocator<int>_>::push_back
                        ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb00,
                         (value_type_conflict2 *)in_stack_fffffffffffffaf8);
            }
          }
          else {
            local_168 = &stack0xffffffffffffffd8;
            local_170._M_current =
                 (CliqueVar *)
                 std::
                 vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
                 begin(&in_stack_fffffffffffffae8->cliqueentries);
            local_178 = (CliqueVar *)
                        std::
                        vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                        ::end(&in_stack_fffffffffffffae8->cliqueentries);
            while (bVar4 = __gnu_cxx::operator!=
                                     ((__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                                       *)in_stack_fffffffffffffaf0,
                                      (__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                                       *)in_stack_fffffffffffffae8), bVar4) {
              pCVar13 = __gnu_cxx::
                        __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                        ::operator*(&local_170);
              local_17c = *pCVar13;
              vertexInfeasible(in_stack_fffffffffffffb20,
                               (HighsDomain *)in_stack_fffffffffffffb18._M_current,
                               (HighsInt)((ulong)in_stack_fffffffffffffb10._M_current >> 0x20),
                               (HighsInt)in_stack_fffffffffffffb10._M_current);
              __gnu_cxx::
              __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
              ::operator++(&local_170);
            }
          }
          std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
          clear((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *
                )0x53e02b);
          processInfeasibleVertices
                    (in_stack_fffffffffffffc20,
                     (HighsDomain *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
          if (local_58 <=
              *(int *)((long)&in_RDI[0x13].
                              super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                              ._M_impl.super__Vector_impl_data._M_start + 4)) break;
        }
      }
    }
  }
  if ((local_59 & 1) != 0) {
    for (local_2d0 = 0; local_2d0 != local_54; local_2d0 = local_2d0 + 1) {
      pvVar8 = std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::
               operator[]((vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                           *)&in_RDI[7].
                              super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_2d0);
      if ((pvVar8->start != -1) &&
         (pvVar8 = std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                   ::operator[]((vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                                 *)&in_RDI[7].
                                    super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                (long)local_2d0), pvVar8->origin == -1)) {
        std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
        clear((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *)
              0x53e0ff);
        std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::end
                  (&in_stack_fffffffffffffae8->cliqueentries);
        __gnu_cxx::
        __normal_iterator<HighsCliqueTable::CliqueVar_const*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>
        ::__normal_iterator<HighsCliqueTable::CliqueVar*>
                  ((__normal_iterator<const_HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                    *)in_stack_fffffffffffffaf0,
                   (__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                    *)in_stack_fffffffffffffae8);
        std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
        begin(&in_stack_fffffffffffffae8->cliqueentries);
        in_stack_fffffffffffffb00 =
             (CliqueVar *)
             &in_RDI[7].
              super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
        std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::operator[]
                  ((vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_> *)
                   in_stack_fffffffffffffb00,(long)local_2d0);
        __gnu_cxx::
        __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
        ::operator+((__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                     *)in_stack_fffffffffffffaf8,(difference_type)in_stack_fffffffffffffaf0);
        std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
        begin(&in_stack_fffffffffffffae8->cliqueentries);
        std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::operator[]
                  ((vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_> *)
                   in_stack_fffffffffffffb00,(long)local_2d0);
        __gnu_cxx::
        __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
        ::operator+((__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                     *)in_stack_fffffffffffffaf8,(difference_type)in_stack_fffffffffffffaf0);
        std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>::
        insert<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>,void>
                  (&in_stack_fffffffffffffb30->cliqueentries,
                   (const_iterator)in_stack_fffffffffffffb48._M_current,in_stack_fffffffffffffb40,
                   (__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                    )in_stack_fffffffffffffb38._M_current);
        removeClique(in_stack_fffffffffffffb30,(HighsInt)((ulong)in_stack_fffffffffffffb28 >> 0x20))
        ;
        runCliqueMerging(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                         (vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                          *)in_stack_fffffffffffffd40._M_current,
                         SUB81((ulong)in_stack_fffffffffffffd38._M_current >> 0x38,0));
        sVar6 = std::
                vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
                size((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                      *)&stack0xffffffffffffffd8);
        if (1 < sVar6) {
          in_stack_fffffffffffffaf0 = (CliqueVar *)&stack0xffffffffffffffd8;
          in_stack_fffffffffffffaf8 =
               std::
               vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
               data((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                     *)0x53e246);
          std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
          size((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *)
               in_stack_fffffffffffffaf0);
          doAddClique(in_stack_fffffffffffffc20,
                      (CliqueVar *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18),
                      (HighsInt)((ulong)in_stack_fffffffffffffc10 >> 0x20),
                      SUB81((ulong)in_stack_fffffffffffffc10 >> 0x18,0),
                      (HighsInt)((ulong)in_stack_fffffffffffffc08 >> 0x20));
        }
      }
    }
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb00);
  std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::~vector
            ((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *)
             in_stack_fffffffffffffb00);
  return;
}

Assistant:

void HighsCliqueTable::runCliqueMerging(HighsDomain& globaldomain) {
  std::vector<CliqueVar> extensionvars;
  iscandidate.resize(invertedHashList.size());
  std::vector<HighsInt> neighbourhoodInds;
  neighbourhoodInds.reserve(invertedHashList.size());

  if (cliquehits.size() < cliques.size()) cliquehits.resize(cliques.size());

  HighsInt numcliqueslots = cliques.size();
  const HighsInt maxNewEntries = numEntries + globaldomain.numModelNonzeros();
  bool haveNonModelCliquesToMerge = false;
  for (HighsInt k = 0; k != numcliqueslots; ++k) {
    if (cliques[k].start == -1) continue;
    if (!cliques[k].equality && cliques[k].origin == kHighsIInf) continue;
    if (cliques[k].origin == -1) {
      haveNonModelCliquesToMerge = true;
      continue;
    }
    HighsInt numclqvars = cliques[k].end - cliques[k].start;
    assert(numclqvars != 0);
    if (numclqvars == 0) continue;

    CliqueVar* clqvars = &cliqueentries[cliques[k].start];

    CliqueVar extensionstart = clqvars[0];
    HighsInt numcliques = numCliques(clqvars[0]);
    for (HighsInt i = 1; i != numclqvars; ++i) {
      HighsInt thisNumClqs = numCliques(clqvars[i]);
      if (thisNumClqs < numcliques) {
        numcliques = thisNumClqs;
        extensionstart = clqvars[i];
      }
    }

    for (HighsInt i = 0; i != numclqvars; ++i)
      iscandidate[clqvars[i].index()] = true;

    auto addCands = [&](HighsInt cliqueid) {
      HighsInt start = cliques[cliqueid].start;
      HighsInt end = cliques[cliqueid].end;

      for (HighsInt i = start; i != end; ++i) {
        if (iscandidate[cliqueentries[i].index()] ||
            globaldomain.isFixed(cliqueentries[i].col))
          continue;

        iscandidate[cliqueentries[i].index()] = true;
        extensionvars.push_back(cliqueentries[i]);
      }
    };

    invertedHashList[extensionstart.index()].for_each(
        [&](HighsInt cliqueid) { addCands(cliqueid); });

    invertedHashListSizeTwo[extensionstart.index()].for_each(
        [&](HighsInt cliqueid) { addCands(cliqueid); });

    for (HighsInt i = 0; i != numclqvars; ++i)
      iscandidate[clqvars[i].index()] = false;
    for (CliqueVar v : extensionvars) iscandidate[v.index()] = false;

    for (HighsInt i = 0; i != numclqvars && !extensionvars.empty(); ++i) {
      if (clqvars[i] == extensionstart) continue;

      HighsInt newSize = shrinkToNeighbourhood(
          neighbourhoodInds, numNeighbourhoodQueries, clqvars[i],
          extensionvars.data(), extensionvars.size());
      extensionvars.erase(extensionvars.begin() + newSize, extensionvars.end());
    }

    if (!extensionvars.empty()) {
      // todo, shuffle extension vars?
      randgen.shuffle(extensionvars.data(), extensionvars.size());
      size_t i = 0;
      while (i < extensionvars.size()) {
        CliqueVar extvar = extensionvars[i];
        i += 1;

        HighsInt newSize =
            i + shrinkToNeighbourhood(
                    neighbourhoodInds, numNeighbourhoodQueries, extvar,
                    extensionvars.data() + i, extensionvars.size() - i);
        extensionvars.erase(extensionvars.begin() + newSize,
                            extensionvars.end());
      }
    }

    if (cliques[k].equality) {
      for (CliqueVar v : extensionvars)
        vertexInfeasible(globaldomain, v.col, v.val);
    } else {
      HighsInt originrow = cliques[k].origin;
      cliques[k].origin = kHighsIInf;

      HighsInt numExtensions = extensionvars.size();
      extensionvars.insert(extensionvars.end(),
                           cliqueentries.begin() + cliques[k].start,
                           cliqueentries.begin() + cliques[k].end);
      extensionvars.erase(
          std::remove_if(
              extensionvars.begin() + numExtensions, extensionvars.end(),
              [&](CliqueVar clqvar) { return colDeleted[clqvar.col]; }),
          extensionvars.end());
      removeClique(k);

      for (CliqueVar v : extensionvars) {
        invertedHashList[v.index()].for_each([&](HighsInt cliqueid) {
          if (cliquehits[cliqueid] == 0) cliquehitinds.push_back(cliqueid);

          ++cliquehits[cliqueid];
        });

        invertedHashListSizeTwo[v.index()].for_each([&](HighsInt cliqueid) {
          if (cliquehits[cliqueid] == 0) cliquehitinds.push_back(cliqueid);

          ++cliquehits[cliqueid];
        });
      }

      bool redundant = false;
      HighsInt dominatingOrigin = kHighsIInf;
      for (HighsInt cliqueid : cliquehitinds) {
        HighsInt hits = cliquehits[cliqueid];
        cliquehits[cliqueid] = 0;

        if (hits == (HighsInt)extensionvars.size()) {
          redundant = true;
          if (cliques[cliqueid].origin != kHighsIInf &&
              cliques[cliqueid].origin != -1)
            dominatingOrigin = cliques[cliqueid].origin;
        } else if (cliques[cliqueid].end - cliques[cliqueid].start -
                       cliques[cliqueid].numZeroFixed ==
                   hits) {
          if (cliques[cliqueid].equality) {
            for (CliqueVar v : extensionvars) {
              bool sizeTwo =
                  cliques[cliqueid].end - cliques[cliqueid].start == 2;
              bool vHasClq =
                  sizeTwo
                      ? invertedHashListSizeTwo[v.index()].contains(cliqueid)
                      : invertedHashList[v.index()].contains(cliqueid);
              if (!vHasClq) infeasvertexstack.push_back(v);
            }
          } else {
            removeClique(cliqueid);
          }
        }
      }

      cliquehitinds.clear();

      if (!redundant) {
        for (HighsInt i = 0; i < numExtensions; ++i)
          cliqueextensions.emplace_back(originrow, extensionvars[i]);

        extensionvars.erase(
            std::remove_if(extensionvars.begin(), extensionvars.end(),
                           [&](CliqueVar v) {
                             return globaldomain.isFixed(v.col) &&
                                    static_cast<int>(
                                        globaldomain.col_lower_[v.col]) ==
                                        static_cast<int>(1 - v.val);
                           }),
            extensionvars.end());

        if (extensionvars.size() > 1)
          doAddClique(extensionvars.data(), extensionvars.size(), false,
                      originrow);
      } else {
        // the extended clique is redundant, check if the row can be removed
        if (dominatingOrigin != kHighsIInf)
          deletedrows.push_back(originrow);
        else {
          // this clique is redundant in the cliquetable but its row is not
          // necessarily. Also there might be rows that have been deleted due to
          // being dominated by this row after adding the lifted entries so they
          // must be added to the cliqueextension vector
          for (HighsInt i = 0; i < numExtensions; ++i)
            cliqueextensions.emplace_back(originrow, extensionvars[i]);
        }
      }
    }

    extensionvars.clear();
    processInfeasibleVertices(globaldomain);

    if (numEntries >= maxNewEntries) break;
    // printf("nonzeroDelta: %d, maxNonzeroDelta: %d\n", nonzeroDelta,
    // maxNonzeroDelta);
  }

  if (haveNonModelCliquesToMerge) {
    for (HighsInt k = 0; k != numcliqueslots; ++k) {
      if (cliques[k].start == -1) continue;
      if (cliques[k].origin != -1) continue;
      // if (cliques[k].end - cliques[k].start <= 1000) continue;

      // printf("numEntries before: %d\n", numEntries);
      extensionvars.clear();
      extensionvars.insert(extensionvars.end(),
                           cliqueentries.begin() + cliques[k].start,
                           cliqueentries.begin() + cliques[k].end);
      removeClique(k);
      runCliqueMerging(globaldomain, extensionvars);

      if (extensionvars.size() > 1)
        doAddClique(extensionvars.data(), extensionvars.size());
    }
  }
}